

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O3

void __thiscall caffe::LayerParameter::set_type(LayerParameter *this,char *value)

{
  LogMessage *other;
  LogFinisher local_51;
  undefined1 local_50 [56];
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
               ,0x390e);
    other = google::protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_50,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_50);
  }
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
  std::__cxx11::string::string((string *)local_50,value,(allocator *)&local_51);
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this->type_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_50);
  if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  return;
}

Assistant:

inline void LayerParameter::set_type(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  set_has_type();
  type_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:caffe.LayerParameter.type)
}